

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int program_options(Parg *pg)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398 [32];
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  allocator<char> local_98 [32];
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  similar_names;
  string local_58 [37];
  allocator_type local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  
  std::__cxx11::string::string<std::allocator<char>>(local_4d8,"nansi",(allocator<char> *)local_78);
  std::__cxx11::string::_M_assign((string *)&pg->name_);
  std::__cxx11::string::string<std::allocator<char>>(local_4b8,"0.1.1 (10.01.2019)",local_98);
  std::__cxx11::string::_M_assign((string *)&pg->version_);
  std::__cxx11::string::~string(local_4b8);
  std::__cxx11::string::~string(local_4d8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_498,"A CLI tool to filter ansi escape sequences and format text streams.",
             (allocator<char> *)local_78);
  std::__cxx11::string::_M_assign((string *)&pg->description_);
  std::__cxx11::string::~string(local_498);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,"[flags] [options] [--] [arguments]",(allocator<char> *)local_78);
  OB::Parg::usage(pg,&local_478);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,"[-v|--version]",(allocator<char> *)local_78);
  OB::Parg::usage(pg,&local_458);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"[-h|--help]",(allocator<char> *)local_78);
  OB::Parg::usage(pg,&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"Examples",local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"nansi --help",&local_32);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"nansi --version",&local_31);
  __l._M_len = 2;
  __l._M_array = (iterator)local_78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f8,__l,&local_33);
  OB::Parg::info(pg,&local_418,&local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_78 + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"Exit Codes",local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"0 -> normal",&local_32);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"1 -> error",&local_31);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e0,__l_00,&local_33);
  OB::Parg::info(pg,&local_3f8,&local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_78 + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"Repository",local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"https://github.com/octobanana/nansi.git",&local_32);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c8,__l_01,(allocator_type *)&local_31);
  OB::Parg::info(pg,&local_3d8,&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"Homepage",local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"https://octobanana.com/software/nansi",&local_32);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_b0,__l_02,(allocator_type *)&local_31);
  OB::Parg::info(pg,&local_3b8,&local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_398,"Brett Robinson (octobanana) <octobanana.dev@gmail.com>",
             (allocator<char> *)local_78);
  std::__cxx11::string::_M_assign((string *)&pg->author_);
  std::__cxx11::string::~string(local_398);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"help,h",(allocator<char> *)local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,"print the help output",local_98);
  OB::Parg::set(pg,&local_378,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"version,v",(allocator<char> *)local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,"print the program version",local_98);
  OB::Parg::set(pg,&local_338,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,"ansi",(allocator<char> *)local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"allow ansi escape sequences",local_98);
  OB::Parg::set(pg,&local_2f8,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"line-wrap",(allocator<char> *)local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"wrap lines at custom width or terminal width",local_98);
  OB::Parg::set(pg,&local_2b8,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"auto-wrap",(allocator<char> *)local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"wrap lines and auto calculate the indent width",local_98);
  OB::Parg::set(pg,&local_278,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"first-wrap",(allocator<char> *)local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"if the indentation level is 0, don\'t wrap the line",local_98);
  OB::Parg::set(pg,&local_238,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"white-space",(allocator<char> *)local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"sequences of whitespace will collapse into a single whitespace",
             local_98);
  OB::Parg::set(pg,&local_1f8,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"width",(allocator<char> *)local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"0",local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"num",&local_32);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"maximum output width",&local_31);
  OB::Parg::set(pg,&local_1b8,&local_198,&local_178,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  pg->is_stdin_ = true;
  iVar2 = OB::Parg::parse(pg);
  if (iVar2 < 1) {
    if (iVar2 < 0) {
      OB::Parg::help_abi_cxx11_((string *)local_78,pg);
      poVar3 = std::operator<<((ostream *)&std::cerr,(string *)local_78);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)local_78);
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error: ");
      std::__cxx11::string::string((string *)local_78,(string *)&pg->error_);
      poVar3 = std::operator<<(poVar3,(string *)local_78);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_78,&pg->similar_);
      if ((undefined1  [8])
          similar_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != local_78) {
        std::operator<<((ostream *)&std::cerr,"did you mean:\n");
        for (; local_78 !=
               (undefined1  [8])
               similar_names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
            local_78 = (undefined1  [8])((long)local_78 + 0x20)) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"  --");
          poVar3 = std::operator<<(poVar3,(string *)local_78);
          std::operator<<(poVar3,"\n");
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78);
      return -1;
    }
  }
  else {
    std::__cxx11::string::string((string *)local_78,(string *)&pg->stdin_);
    std::__cxx11::string::~string((string *)local_78);
    if (similar_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      OB::Parg::help_abi_cxx11_((string *)local_78,pg);
      poVar3 = std::operator<<((ostream *)&std::cerr,(string *)local_78);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)local_78);
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error: ");
      poVar3 = std::operator<<(poVar3,"expected arguments");
      std::operator<<(poVar3,"\n");
      return -1;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"help",(allocator<char> *)local_78);
  bVar1 = OB::Parg::get<bool>(pg,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  if (bVar1) {
    OB::Parg::help_abi_cxx11_((string *)local_78,pg);
    std::operator<<((ostream *)&std::cerr,(string *)local_78);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"version",(allocator<char> *)local_78);
    bVar1 = OB::Parg::get<bool>(pg,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    if (!bVar1) {
      return 0;
    }
    std::__cxx11::string::string((string *)local_78,(string *)&pg->name_);
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)local_78);
    poVar3 = std::operator<<(poVar3," v");
    std::__cxx11::string::string((string *)local_98,(string *)&pg->version_);
    poVar3 = std::operator<<(poVar3,(string *)local_98);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)local_98);
  }
  std::__cxx11::string::~string((string *)local_78);
  return 1;
}

Assistant:

int program_options(Parg& pg)
{
  pg.name("nansi").version("0.1.1 (10.01.2019)");
  pg.description("A CLI tool to filter ansi escape sequences and format text streams.");
  pg.usage("[flags] [options] [--] [arguments]");
  pg.usage("[-v|--version]");
  pg.usage("[-h|--help]");
  pg.info("Examples", {
    "nansi --help",
    "nansi --version",
  });
  pg.info("Exit Codes", {"0 -> normal", "1 -> error"});
  pg.info("Repository", {
    "https://github.com/octobanana/nansi.git",
  });
  pg.info("Homepage", {
    "https://octobanana.com/software/nansi",
  });
  pg.author("Brett Robinson (octobanana) <octobanana.dev@gmail.com>");

  // general flags
  pg.set("help,h", "print the help output");
  pg.set("version,v", "print the program version");

  pg.set("ansi", "allow ansi escape sequences");
  pg.set("line-wrap", "wrap lines at custom width or terminal width");
  pg.set("auto-wrap", "wrap lines and auto calculate the indent width");
  pg.set("first-wrap", "if the indentation level is 0, don't wrap the line");
  pg.set("white-space", "sequences of whitespace will collapse into a single whitespace");

  pg.set("width", "0", "num", "maximum output width");

  pg.set_stdin();

  int status {pg.parse()};

  if (status > 0 && pg.get_stdin().empty())
  {
    std::cerr << pg.help() << "\n";
    std::cerr << "Error: " << "expected arguments" << "\n";

    return -1;
  }

  if (status < 0)
  {
    std::cerr << pg.help() << "\n";
    std::cerr << "Error: " << pg.error() << "\n";

    auto similar_names = pg.similar();
    if (similar_names.size() > 0)
    {
      std::cerr
      << "did you mean:\n";
      for (auto const& e : similar_names)
      {
        std::cerr
        << "  --" << e << "\n";
      }
    }

    return -1;
  }

  if (pg.get<bool>("help"))
  {
    std::cerr << pg.help();

    return 1;
  }

  if (pg.get<bool>("version"))
  {
    std::cerr << pg.name() << " v" << pg.version() << "\n";

    return 1;
  }

  return 0;
}